

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriterState::PrimitiveColumnWriterState
          (PrimitiveColumnWriterState *this,ParquetWriter *writer_p,RowGroup *row_group,
          idx_t col_idx)

{
  (this->super_ColumnWriterState).is_empty.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->super_ColumnWriterState).is_empty.
                   super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish + 8) = 0;
  (this->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_ColumnWriterState).repetition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ColumnWriterState).is_empty.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start + 4)
       = 0;
  (this->super_ColumnWriterState).null_count = 0;
  (this->super_ColumnWriterState).is_empty.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->super_ColumnWriterState).parent_null_count = 0;
  (this->super_ColumnWriterState)._vptr_ColumnWriterState =
       (_func_int **)&PTR__PrimitiveColumnWriterState_004d8020;
  this->writer = writer_p;
  this->row_group = row_group;
  this->col_idx = col_idx;
  (this->page_info).super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>.
  super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->page_info).super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>.
  super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->page_info).super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>.
  super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->write_info).
  super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->write_info).
  super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->write_info).
  super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stats_state).
  super_unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterStatistics_*,_std::default_delete<duckdb::ColumnWriterStatistics>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterStatistics_*,_false>._M_head_impl =
       (ColumnWriterStatistics *)0x0;
  this->current_page = 0;
  (this->bloom_filter).
  super_unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetBloomFilter_*,_std::default_delete<duckdb::ParquetBloomFilter>_>
  .super__Head_base<0UL,_duckdb::ParquetBloomFilter_*,_false>._M_head_impl =
       (ParquetBloomFilter *)0x0;
  std::vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>::emplace_back<>
            (&(this->page_info).
              super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>);
  return;
}

Assistant:

PrimitiveColumnWriterState(ParquetWriter &writer_p, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : writer(writer_p), row_group(row_group), col_idx(col_idx) {
		page_info.emplace_back();
	}